

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_1,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *kernel)

{
  long index;
  long lVar1;
  
  lVar1 = (kernel->m_dstExpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
          m_storage.m_cols *
          (kernel->m_dstExpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
          m_storage.m_rows;
  index = 0;
  if (lVar1 < 1) {
    lVar1 = index;
  }
  for (; lVar1 != index; index = index + 1) {
    generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
    ::assignCoeff(kernel,index);
  }
  return;
}

Assistant:

void run(Kernel &kernel)
  {
    const Index size = kernel.size();
    for(Index i = 0; i < size; ++i)
      kernel.assignCoeff(i);
  }